

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

char * CVmObjBigNum::round_val(vm_val_t *new_val,char *ext,size_t digits,int always_create)

{
  byte bVar1;
  byte bVar2;
  char *ext_00;
  bool bVar3;
  int16_t tmp_1;
  int iVar4;
  vm_obj_id_t vVar5;
  uint16_t tmp;
  
  if (((ext[4] & 6U) == 0) && (iVar4 = get_round_dir(ext,(int)digits), iVar4 != 0)) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (always_create == 0) {
      new_val->typ = VM_NIL;
      return ext;
    }
  }
  vVar5 = create(0,digits);
  new_val->typ = VM_OBJ;
  (new_val->val).obj = vVar5;
  ext_00 = *(char **)((long)&G_obj_table_X.pages_[vVar5 >> 0xc][vVar5 & 0xfff].ptr_ + 8);
  *(short *)ext_00 = (short)digits;
  bVar1 = ext[4];
  bVar2 = ext_00[4];
  ext_00[4] = bVar2 & 0xfe | bVar1 & 1;
  *(undefined2 *)(ext_00 + 2) = *(undefined2 *)(ext + 2);
  ext_00[4] = bVar2 & 0xf8 | bVar1 & 1 | ext[4] & 6U;
  if (bVar3) {
    if (*(ushort *)ext < digits) {
      copy_val(ext_00,ext,0);
    }
    else {
      memcpy(ext_00 + 5,ext + 5,digits + 1 >> 1);
    }
  }
  else {
    memcpy(ext_00 + 5,ext + 5,digits + 1 >> 1);
    round_up_abs(ext_00,(int)digits);
  }
  return ext_00;
}

Assistant:

const char *CVmObjBigNum::round_val(VMG_ vm_val_t *new_val, const char *ext,
                                    size_t digits, int always_create)
{
    /* presume we need rounding */
    int need_round = TRUE;

    /* 
     *   if the value is already no longer than the requested precision,
     *   return the original value; similarly, if we don't have to do any
     *   rounding to truncate to the requested precision, do not change
     *   the original object; likewise, don't bother changing anything if
     *   it's not a number 
     */
    if (get_type(ext) != VMBN_T_NUM || !get_round_dir(ext, digits))
    {
        if (always_create)
        {
            /* 
             *   we must create a new object regardless, but it won't need
             *   rounding 
             */
            need_round = FALSE;
        }
        else
        {
            /* return the original value */
            new_val->set_nil();
            return ext;
        }
    }

    /* allocate a new object with the requested precision */
    new_val->set_obj(create(vmg_ FALSE, digits));
    char *new_ext = get_objid_ext(vmg_ new_val->val.obj);

    /* copy the sign, exponent, and type information */
    set_prec(new_ext, digits);
    set_neg(new_ext, get_neg(ext));
    set_exp(new_ext, get_exp(ext));
    set_type(new_ext, get_type(ext));

    /* 
     *   if we don't need rounding, just truncate the old mantissa and
     *   return the result 
     */
    if (!need_round)
    {
        /* if the new size is smaller, truncate it */
        if (digits <= get_prec(ext))
        {
            /* copy the mantissa up to the requested new size */
            memcpy(new_ext + VMBN_MANT, ext + VMBN_MANT, (digits + 1)/2);
        }
        else
        {
            /* it's growing - simply copy the old value */
            copy_val(new_ext, ext, FALSE);
        }

        /* return the new value */
        return new_ext;
    }
    
    /* copy the mantissa up to the requested new precision */
    memcpy(new_ext + VMBN_MANT, ext + VMBN_MANT, (digits + 1)/2);

    /* round it up */
    round_up_abs(new_ext, digits);

    /* return the new extension */
    return new_ext;
}